

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.cpp
# Opt level: O1

void __thiscall Constraint::Constraint(Constraint *this,int indexInTuple,string *value)

{
  (this->val)._M_dataplus._M_p = (pointer)&(this->val).field_2;
  (this->val)._M_string_length = 0;
  (this->val).field_2._M_local_buf[0] = '\0';
  this->indexInTuple = indexInTuple;
  std::__cxx11::string::_M_assign((string *)this);
  this->ind = -1;
  return;
}

Assistant:

Constraint::Constraint(int indexInTuple,string value)
{
 this->indexInTuple = indexInTuple;
 val = value;
 ind = -1;
}